

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::stepBy(QDateTimeEdit *this,int steps)

{
  QDateTimeEditPrivate *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  bVar1 = QAbstractSpinBoxPrivate::specialValue(&this_00->super_QAbstractSpinBoxPrivate);
  if (((bVar1) &&
      (*(int *)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8 + 0x470) != 1)) &&
     (*(long *)&this_00->field_0x418 != 0)) {
    uVar3 = 0;
    do {
      iVar2 = QDateTimeParser::sectionType((int)this_00 + 0x3d8);
      if (iVar2 != 1) {
        *(int *)&this_00->field_0x3e0 = (int)uVar3;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ulong *)&this_00->field_0x418);
  }
  QDateTimeEditPrivate::stepBy
            ((QDateTimeEditPrivate *)local_50,(int)this_00,*(int *)&this_00->field_0x3e0,
             SUB41(steps,0));
  ::QVariant::QVariant(&local_48,(QDateTime *)local_50);
  QAbstractSpinBoxPrivate::setValue
            (&this_00->super_QAbstractSpinBoxPrivate,&local_48,EmitIfChanged,true);
  ::QVariant::~QVariant(&local_48);
  QDateTime::~QDateTime((QDateTime *)local_50);
  (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_48,this_00);
  QDateTimeEditPrivate::updateCache
            (this_00,&(this_00->super_QAbstractSpinBoxPrivate).value,(QString *)&local_48);
  if ((QArrayData *)local_48.d.data.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_48.d.data.shared = *(int *)local_48.d.data.shared + -1;
    UNLOCK();
    if (*(int *)local_48.d.data.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_48.d.data.shared,2,0x10);
    }
  }
  QDateTimeEditPrivate::setSelected(this_00,*(int *)&this_00->field_0x3e0,false);
  QDateTimeEditPrivate::updateTimeZone(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::stepBy(int steps)
{
    Q_D(QDateTimeEdit);
#ifdef QT_KEYPAD_NAVIGATION
    // with keypad navigation and not editFocus, left right change the date/time by a fixed amount.
    if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
        // if date based, shift by day.  else shift by 15min
        if (d->sections & DateSections_Mask) {
            setDateTime(dateTime().addDays(steps));
        } else {
            int minutes = time().hour()*60 + time().minute();
            int blocks = minutes/15;
            blocks += steps;
            /* rounding involved */
            if (minutes % 15) {
                if (steps < 0) {
                    blocks += 1; // do one less step;
                }
            }

            minutes = blocks * 15;

            /* need to take wrapping into account */
            if (!d->wrapping) {
                int max_minutes = d->maximum.toTime().hour()*60 + d->maximum.toTime().minute();
                int min_minutes = d->minimum.toTime().hour()*60 + d->minimum.toTime().minute();

                if (minutes >= max_minutes) {
                    setTime(maximumTime());
                    return;
                } else if (minutes <= min_minutes) {
                    setTime(minimumTime());
                    return;
                }
            }
            setTime(QTime(minutes/60, minutes%60));
        }
        return;
    }
#endif
    // don't optimize away steps == 0. This is the only way to select
    // the currentSection in Qt 4.1.x
    if (d->specialValue() && displayedSections() != AmPmSection) {
        for (int i=0; i<d->sectionNodes.size(); ++i) {
            if (d->sectionType(i) != QDateTimeParser::AmPmSection) {
                d->currentSectionIndex = i;
                break;
            }
        }
    }
    d->setValue(d->stepBy(d->currentSectionIndex, steps, false), EmitIfChanged);
    d->updateCache(d->value, d->displayText());

    d->setSelected(d->currentSectionIndex);
    d->updateTimeZone();
}